

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_construct_destruct_withAllocator_invalid_fn(int _i)

{
  AString *pAVar1;
  int line;
  
  private_ACUtilsTest_AString_freeCount = 0;
  private_ACUtilsTest_AString_reallocFail = 0;
  private_ACUtilsTest_AString_reallocCount = 0;
  pAVar1 = AString_constructWithAllocator((ACUtilsReallocator)0x0,private_ACUtilsTest_AString_free);
  if (pAVar1 == (AString *)0x0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x94);
    pAVar1 = AString_constructWithAllocator
                       (private_ACUtilsTest_AString_realloc,(ACUtilsDeallocator)0x0);
    if (pAVar1 == (AString *)0x0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x96);
      return;
    }
    line = 0x96;
  }
  else {
    line = 0x94;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,line,"Assertion \'_ck_x == NULL\' failed","Assertion \'%s\' failed: %s == %#x",
                    "(void*) string == NULL","(void*) string",pAVar1,0);
}

Assistant:

END_TEST
START_TEST(test_AString_construct_destruct_withAllocator_invalid)
{
    struct AString *string;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    private_ACUtilsTest_AString_reallocCount = private_ACUtilsTest_AString_freeCount = 0;
    string = AString_constructWithAllocator(nullptr, private_ACUtilsTest_AString_free);
    ACUTILSTEST_ASSERT_PTR_NULL(string);
    string = AString_constructWithAllocator(private_ACUtilsTest_AString_realloc, nullptr);
    ACUTILSTEST_ASSERT_PTR_NULL(string);
}